

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::RgbaOutputFile::writePixels(RgbaOutputFile *this,int numScanLines)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_toYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    OutputFile::writePixels(this->_outputFile,numScanLines);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    ToYca::writePixels(this->_toYca,numScanLines);
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void	
RgbaOutputFile::writePixels (int numScanLines)
{
    if (_toYca)
    {
	Lock lock (*_toYca);
	_toYca->writePixels (numScanLines);
    }
    else
    {
	_outputFile->writePixels (numScanLines);
    }
}